

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * cmsys::regnext(char *p)

{
  ushort uVar1;
  
  if ((p != &regdummy) && (uVar1 = *(ushort *)(p + 1) << 8 | *(ushort *)(p + 1) >> 8, uVar1 != 0)) {
    if (*p == '\a') {
      return p + -(ulong)uVar1;
    }
    return p + uVar1;
  }
  return (char *)0x0;
}

Assistant:

static char* regnext(char* p)
{
  int offset;

  if (p == regdummyptr)
    return (KWSYS_NULLPTR);

  offset = NEXT(p);
  if (offset == 0)
    return (KWSYS_NULLPTR);

  if (OP(p) == BACK)
    return (p - offset);
  else
    return (p + offset);
}